

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomOneAction.cpp
# Opt level: O0

ActionResults * __thiscall GreenRoomOneAction::Go(GreenRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *pAVar4;
  bool bVar5;
  allocator local_d1;
  string local_d0 [38];
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [38];
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  itemType local_60 [2];
  undefined1 local_55;
  allocator local_41;
  string local_40 [36];
  itemType local_1c;
  GreenRoomOneAction *local_18;
  GreenRoomOneAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  bVar5 = false;
  if (iVar1 == WEST) {
    local_1c = G_ROOM_STATE;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_1c);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    bVar5 = iVar2 == NOT_WON;
  }
  if (bVar5) {
    pAVar4 = (ActionResults *)operator_new(0x30);
    local_55 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"The path is blocked.\n",&local_41);
    ActionResults::ActionResults(pAVar4,CURRENT,(string *)local_40);
    local_55 = 0;
    this_local = (GreenRoomOneAction *)pAVar4;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    bVar5 = false;
    if (iVar1 == WEST) {
      local_60[1] = 0xe;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_60 + 1);
      iVar2 = ItemWrapper::getLocation(pIVar3);
      bVar5 = iVar2 == WON;
    }
    if (bVar5) {
      local_60[0] = PLAYER;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_60);
      ItemWrapper::setLocation(pIVar3,G_ROOM2_BUCKET);
      pAVar4 = (ActionResults *)operator_new(0x30);
      local_82 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"You move to the green room 2",&local_81);
      ActionResults::ActionResults(pAVar4,G_ROOM2_BUCKET,(string *)local_80);
      local_82 = 0;
      this_local = (GreenRoomOneAction *)pAVar4;
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    else {
      iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
      if (iVar1 == EAST) {
        pAVar4 = (ActionResults *)operator_new(0x30);
        local_aa = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,"You can\'t go back, the door is locked.",&local_a9);
        ActionResults::ActionResults(pAVar4,CURRENT,(string *)local_a8);
        local_aa = 0;
        this_local = (GreenRoomOneAction *)pAVar4;
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      }
      else {
        pAVar4 = (ActionResults *)operator_new(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"You can\'t go there.",&local_d1);
        ActionResults::ActionResults(pAVar4,CURRENT,(string *)local_d0);
        this_local = (GreenRoomOneAction *)pAVar4;
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      }
    }
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults *GreenRoomOneAction::Go() {

    if (commands->getMainItem() == WEST && itemList->getValue(G_ROOM_STATE)->getLocation() == NOT_WON) {
        return new ActionResults(CURRENT, "The path is blocked.\n");
    } else if (commands->getMainItem() == WEST && itemList->getValue(G_ROOM_STATE)->getLocation() == WON){
        itemList->getValue(PLAYER)->setLocation(G_ROOM2_BUCKET);
        return new ActionResults(G_ROOM2_BUCKET, "You move to the green room 2");
    } else if (commands->getMainItem() == EAST) {
        return new ActionResults(CURRENT, "You can't go back, the door is locked.");
    }
    return new ActionResults(CURRENT,"You can't go there.");
}